

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

int insert_lock(ll_elem *n)

{
  ulong uVar1;
  bool bVar2;
  ulong local_20;
  uintptr_t zero;
  ll_elem *n_local;
  
  local_20 = 0;
  while( true ) {
    LOCK();
    uVar1 = n->succ;
    bVar2 = local_20 == uVar1;
    if (bVar2) {
      n->succ = (ulong)((uint)local_20 & 1) | 2;
      uVar1 = local_20;
    }
    UNLOCK();
    if (bVar2) break;
    local_20 = uVar1;
    if ((uVar1 & 0xfffffffffffffffe) != 0) {
      return 0;
    }
  }
  do {
  } while ((n->pred & 0xfffffffffffffffe) != 0);
  return 1;
}

Assistant:

static __inline int
insert_lock(struct ll_elem *n)
{
	uintptr_t zero = 0;

	/* Mark succ as flagged, preserving the DEREF bit. */
	while (!atomic_compare_exchange_weak_explicit(&n->succ, &zero,
	    FLAGGED | (zero & DEREF),
	    memory_order_acquire, memory_order_relaxed)) {
		if (zero & ~DEREF)
			return 0;
	}
	/* Wait for pred to fall to zero. */
	while (atomic_load_explicit(&n->pred, memory_order_relaxed) & ~DEREF)
		SPINWAIT();

	return 1;
}